

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O3

int Fra_SmlNodeCountOnes(Fra_Sml_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = p->nWordsTotal;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      uVar2 = *(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(pObj->Id * iVar1) * 4);
      uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
      uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
      iVar3 = (uVar2 >> 0x10) + iVar3 + (uVar2 & 0xffff);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
    return iVar3;
  }
  return 0;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }